

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O0

void __thiscall tst_helpers_reduce::delayedRejected(tst_helpers_reduce *this)

{
  qsizetype *fn;
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  bool bVar1;
  int local_1d8 [8];
  iterator local_1b8;
  undefined8 local_1b0;
  QList<int> local_1a8;
  int local_18c [3];
  iterator local_180;
  undefined8 local_178;
  QList<int> local_170;
  QString local_158;
  QString local_140;
  QString local_128;
  QString local_110;
  QString local_f8;
  QString local_e0;
  bool local_c2;
  bool local_c1 [7];
  bool local_ba;
  bool local_b9;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_b8;
  undefined1 local_b0 [8];
  Type p1;
  undefined1 local_88 [8];
  Type p0;
  QVector<int> v1;
  QVector<int> v0;
  undefined1 local_28 [8];
  QVector<int> inputs;
  tst_helpers_reduce *this_local;
  
  v0.d.size._4_4_ = 4;
  args_01._M_len = 3;
  args_01._M_array = (iterator)((long)&v0.d.size + 4);
  inputs.d.size = (qsizetype)this;
  QList<int>::QList((QList<int> *)local_28,args_01);
  fn = &v1.d.size;
  QList<int>::QList((QList<int> *)fn);
  QList<int>::QList((QList<int> *)&p0.super_QPromiseBase<int>.m_d);
  QtPromise::
  reduce<int,_QList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_helpers_tst_reduce_cpp:225:41)>
            ((QtPromise *)local_88,(QList<int> *)local_28,(anon_class_8_1_3fcf6738)fn);
  local_b8 = &p0.super_QPromiseBase<int>.m_d;
  QtPromise::
  reduce<int,_QList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_helpers_tst_reduce_cpp:234:9),_int>
            ((QtPromise *)local_b0,(QList<int> *)local_28,(anon_class_8_1_3fcf6739)local_b8,2);
  local_b9 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_88);
  local_ba = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_b9,&local_ba,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                     ,0xf6);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_c1[0] = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_b0);
    local_c2 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_c1,&local_c2,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0xf7);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QString::QString(&local_f8);
      waitForError<int,QString>(&local_e0,(QPromise<int> *)local_88,&local_f8);
      QString::QString(&local_110,"foo");
      bVar1 = QTest::qCompare(&local_e0,&local_110,"waitForError(p0, QString{})","QString{\"foo\"}",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0xf8);
      QString::~QString(&local_110);
      QString::~QString(&local_e0);
      QString::~QString(&local_f8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_140);
        waitForError<int,QString>(&local_128,(QPromise<int> *)local_b0,&local_140);
        QString::QString(&local_158,"bar");
        bVar1 = QTest::qCompare(&local_128,&local_158,"waitForError(p1, QString{})",
                                "QString{\"bar\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                ,0xf9);
        QString::~QString(&local_158);
        QString::~QString(&local_128);
        QString::~QString(&local_140);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_18c[0] = 4;
          local_18c[1] = 6;
          local_18c[2] = 1;
          local_180 = local_18c;
          local_178 = 3;
          args_00._M_len = 3;
          args_00._M_array = local_180;
          QList<int>::QList(&local_170,args_00);
          bVar1 = QTest::qCompare<int>
                            ((QList<int> *)&v1.d.size,&local_170,"v0","(QVector<int>{4, 6, 1})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                             ,0xfa);
          QList<int>::~QList(&local_170);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_1d8[0] = 2;
            local_1d8[1] = 4;
            local_1d8[2] = 0;
            local_1d8[3] = 6;
            local_1d8[4] = 6;
            local_1d8[5] = 1;
            local_1b8 = local_1d8;
            local_1b0 = 6;
            args._M_len = 6;
            args._M_array = local_1b8;
            QList<int>::QList(&local_1a8,args);
            bVar1 = QTest::qCompare<int>
                              ((QList<int> *)&p0.super_QPromiseBase<int>.m_d,&local_1a8,"v1",
                               "(QVector<int>{2, 4, 0, 6, 6, 1})",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                               ,0xfb);
            QList<int>::~QList(&local_1a8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_c1[1] = false;
              local_c1[2] = false;
              local_c1[3] = false;
              local_c1[4] = false;
            }
            else {
              local_c1[1] = true;
              local_c1[2] = false;
              local_c1[3] = false;
              local_c1[4] = false;
            }
          }
          else {
            local_c1[1] = true;
            local_c1[2] = false;
            local_c1[3] = false;
            local_c1[4] = false;
          }
        }
        else {
          local_c1[1] = true;
          local_c1[2] = false;
          local_c1[3] = false;
          local_c1[4] = false;
        }
      }
      else {
        local_c1[1] = true;
        local_c1[2] = false;
        local_c1[3] = false;
        local_c1[4] = false;
      }
    }
    else {
      local_c1[1] = true;
      local_c1[2] = false;
      local_c1[3] = false;
      local_c1[4] = false;
    }
  }
  else {
    local_c1[1] = true;
    local_c1[2] = false;
    local_c1[3] = false;
    local_c1[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_b0);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_88);
  QList<int>::~QList((QList<int> *)&p0.super_QPromiseBase<int>.m_d);
  QList<int>::~QList((QList<int> *)&v1.d.size);
  QList<int>::~QList((QList<int> *)local_28);
  return;
}

Assistant:

void tst_helpers_reduce::delayedRejected()
{
    QVector<int> inputs{4, 6, 8};
    QVector<int> v0;
    QVector<int> v1;

    auto p0 = QtPromise::reduce(inputs, [&](int acc, int cur, int idx) {
        v0 << acc << cur << idx;
        if (cur == 6) {
            return QtPromise::QPromise<int>::reject(QString{"foo"});
        }
        return QtPromise::resolve(acc + cur + idx);
    });
    auto p1 = QtPromise::reduce(
        inputs,
        [&](int acc, int cur, int idx) {
            v1 << acc << cur << idx;
            if (cur == 6) {
                return QtPromise::QPromise<int>::reject(QString{"bar"});
            }
            return QtPromise::resolve(acc + cur + idx);
        },
        2);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});
    QCOMPARE(waitForError(p1, QString{}), QString{"bar"});
    QCOMPARE(v0, (QVector<int>{4, 6, 1}));
    QCOMPARE(v1, (QVector<int>{2, 4, 0, 6, 6, 1}));
}